

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O3

void __thiscall zmq::plain_server_t::produce_error(plain_server_t *this,msg_t *msg_)

{
  int iVar1;
  undefined4 *puVar2;
  
  if ((this->super_zap_client_common_handshake_t).super_zap_client_t.status_code._M_string_length !=
      3) {
    produce_error();
  }
  iVar1 = msg_t::init_size(msg_,9);
  if (iVar1 != 0) {
    produce_error();
  }
  puVar2 = (undefined4 *)msg_t::data(msg_);
  *puVar2 = 0x4f52525e;
  *(undefined2 *)(puVar2 + 1) = 0x352;
  memcpy((void *)((long)puVar2 + 6),
         (this->super_zap_client_common_handshake_t).super_zap_client_t.status_code._M_dataplus._M_p
         ,(this->super_zap_client_common_handshake_t).super_zap_client_t.status_code.
          _M_string_length);
  return;
}

Assistant:

void zmq::plain_server_t::produce_error (msg_t *msg_) const
{
    const char expected_status_code_len = 3;
    zmq_assert (status_code.length ()
                == static_cast<size_t> (expected_status_code_len));
    const size_t status_code_len_size = sizeof (expected_status_code_len);
    const int rc = msg_->init_size (error_prefix_len + status_code_len_size
                                    + expected_status_code_len);
    zmq_assert (rc == 0);
    char *msg_data = static_cast<char *> (msg_->data ());
    memcpy (msg_data, error_prefix, error_prefix_len);
    msg_data[error_prefix_len] = expected_status_code_len;
    memcpy (msg_data + error_prefix_len + status_code_len_size,
            status_code.c_str (), status_code.length ());
}